

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O2

void __thiscall
QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneHoverEvent *event)

{
  byte bVar1;
  SubControl SVar2;
  QGraphicsItem *pQVar3;
  WindowData *pWVar4;
  QGraphicsItem *pQVar5;
  long in_FS_OFFSET;
  QRectF QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((~(this->windowFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 0x1001) == 0) {
    pQVar3 = (this->super_QGraphicsItemPrivate).q_ptr;
    pQVar5 = pQVar3 + -1;
    if (pQVar3 == (QGraphicsItem *)0x0) {
      pQVar5 = (QGraphicsItem *)0x0;
    }
    QGraphicsItem::unsetCursor(pQVar5 + 1);
    ensureWindowData(this);
    pWVar4 = (this->windowData)._M_t.
             super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ._M_t.
             super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
    SVar2 = pWVar4->hoveredSubControl;
    bVar1 = pWVar4->field_0x20;
    pWVar4->hoveredSubControl = SC_None;
    pWVar4->field_0x20 = bVar1 & 0xfe;
    pWVar4 = (this->windowData)._M_t.
             super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             ._M_t.
             super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
             .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
    (pWVar4->buttonRect).x1 = 0;
    (pWVar4->buttonRect).y1 = 0;
    (pWVar4->buttonRect).x2 = -1;
    (pWVar4->buttonRect).y2 = -1;
    if (SVar2 == SC_ComboBoxListBoxPopup || (bVar1 & 1) != 0) {
      QRectF::QRectF(&QStack_38,
                     &((this->windowData)._M_t.
                       super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
                       .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>.
                      _M_head_impl)->buttonRect);
      QGraphicsItem::update(pQVar5 + 1,&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameHoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_Q(QGraphicsWidget);
    if (hasDecoration()) {
        // ### restore the cursor, don't override it
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif

        ensureWindowData();

        bool needsUpdate = false;
        if (windowData->hoveredSubControl == QStyle::SC_TitleBarCloseButton
            || windowData->buttonMouseOver)
            needsUpdate = true;

        // update the hover state (of buttons etc...)
        windowData->hoveredSubControl = QStyle::SC_None;
        windowData->buttonMouseOver = false;
        windowData->buttonRect = QRect();
        if (needsUpdate)
            q->update(windowData->buttonRect);
    }
}